

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool IR::Instr::HasSymUseDst(StackSym *sym,Opnd *dst)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  IndirOpnd *pIVar4;
  ListOpnd *this;
  ListOpndType *dst_00;
  SymOpnd *this_00;
  StackSym *pSVar5;
  PropertySymOpnd *this_01;
  int i;
  int i_00;
  
  if (dst != (Opnd *)0x0) {
    bVar2 = Opnd::IsIndirOpnd(dst);
    if (bVar2) {
      pIVar4 = Opnd::AsIndirOpnd(dst);
      if ((pIVar4->m_baseOpnd != (RegOpnd *)0x0) && (pIVar4->m_baseOpnd->m_sym == sym)) {
        return true;
      }
      if (pIVar4->m_indexOpnd == (RegOpnd *)0x0) {
        return false;
      }
      pSVar5 = pIVar4->m_indexOpnd->m_sym;
    }
    else {
      bVar2 = Opnd::IsListOpnd(dst);
      if (bVar2) {
        this = Opnd::AsListOpnd(dst);
        i_00 = 0;
        do {
          iVar1 = this->count;
          bVar2 = i_00 < iVar1;
          if (iVar1 <= i_00) {
            return bVar2;
          }
          dst_00 = ListOpnd::Item(this,i_00);
          bVar3 = HasSymUseDst(sym,&dst_00->super_Opnd);
          i_00 = i_00 + 1;
        } while (!bVar3);
        return bVar2;
      }
      bVar2 = Opnd::IsSymOpnd(dst);
      if (!bVar2) {
        return false;
      }
      this_00 = Opnd::AsSymOpnd(dst);
      pSVar5 = (StackSym *)Opnd::GetSym(&this_00->super_Opnd);
      if (pSVar5 == sym) {
        return true;
      }
      bVar2 = SymOpnd::IsPropertySymOpnd(this_00);
      if (!bVar2) {
        return false;
      }
      this_01 = Opnd::AsPropertySymOpnd(&this_00->super_Opnd);
      pSVar5 = PropertySymOpnd::GetObjectSym(this_01);
    }
    if (pSVar5 == sym) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Instr::HasSymUseDst(StackSym *sym, IR::Opnd* dst)
{
    if (!dst)
    {
        return false;
    }
    if (dst->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = dst->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (dst->IsListOpnd())
    {
        IR::ListOpnd* list = dst->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseDst(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (dst->IsSymOpnd())
    {
        SymOpnd* symOpnd = dst->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}